

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::insert
          (QMovableArrayOps<QRectF> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QRectF *pQVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  QRectF *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Inserter local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = t->xp;
  qVar3 = t->yp;
  qVar4 = t->w;
  qVar5 = t->h;
  bVar8 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size != 0;
  QArrayDataPointer<QRectF>::detachAndGrow
            ((QArrayDataPointer<QRectF> *)this,(uint)(i == 0 && bVar8),n,(QRectF **)0x0,
             (QArrayDataPointer<QRectF> *)0x0);
  local_68 = SUB84(qVar2,0);
  uStack_64 = (undefined4)((ulong)qVar2 >> 0x20);
  uStack_60 = SUB84(qVar3,0);
  uStack_5c = (undefined4)((ulong)qVar3 >> 0x20);
  local_78 = SUB84(qVar4,0);
  uStack_74 = (undefined4)((ulong)qVar4 >> 0x20);
  uStack_70 = SUB84(qVar5,0);
  uStack_6c = (undefined4)((ulong)qVar5 >> 0x20);
  if (i == 0 && bVar8) {
    lVar7 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
    pQVar1 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
    while( true ) {
      lVar7 = lVar7 + 1;
      pQVar6 = pQVar1 + -1;
      bVar8 = n == 0;
      n = n + -1;
      if (bVar8) break;
      *(undefined4 *)&pQVar6->xp = local_68;
      *(undefined4 *)((long)&pQVar1[-1].xp + 4) = uStack_64;
      *(undefined4 *)&pQVar1[-1].yp = uStack_60;
      *(undefined4 *)((long)&pQVar1[-1].yp + 4) = uStack_5c;
      *(undefined4 *)&pQVar1[-1].w = local_78;
      *(undefined4 *)((long)&pQVar1[-1].w + 4) = uStack_74;
      *(undefined4 *)&pQVar1[-1].h = uStack_70;
      *(undefined4 *)((long)&pQVar1[-1].h + 4) = uStack_6c;
      (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr = pQVar6;
      (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size = lVar7;
      pQVar1 = pQVar6;
    }
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QRectF> *)this,i,n);
    while (bVar8 = n != 0, n = n + -1, bVar8) {
      *(undefined4 *)&(local_58.displaceFrom)->xp = local_68;
      *(undefined4 *)((long)&(local_58.displaceFrom)->xp + 4) = uStack_64;
      *(undefined4 *)&(local_58.displaceFrom)->yp = uStack_60;
      *(undefined4 *)((long)&(local_58.displaceFrom)->yp + 4) = uStack_5c;
      *(undefined4 *)&(local_58.displaceFrom)->w = local_78;
      *(undefined4 *)((long)&(local_58.displaceFrom)->w + 4) = uStack_74;
      *(undefined4 *)&(local_58.displaceFrom)->h = uStack_70;
      *(undefined4 *)((long)&(local_58.displaceFrom)->h + 4) = uStack_6c;
      local_58.displaceFrom = local_58.displaceFrom + 1;
    }
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }